

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O3

void __thiscall
VectorSUnitTest_initializer_list_assign_function_Test::
~VectorSUnitTest_initializer_list_assign_function_Test
          (VectorSUnitTest_initializer_list_assign_function_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(VectorSUnitTest, initializer_list_assign_function)
{
    vector_s<std::string, 10> vs;
    vs.assign({"00","11","22","33","44"});
    EXPECT_FALSE(vs.empty());
    EXPECT_EQ(5u, vs.size());
    EXPECT_EQ(std::string("00"), vs[0]);
    EXPECT_EQ(std::string("11"), vs[1]);
    EXPECT_EQ(std::string("22"), vs[2]);
    EXPECT_EQ(std::string("33"), vs[3]);
    EXPECT_EQ(std::string("44"), vs[4]);
}